

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Hpipe::anon_unknown_7::PcMaker::PcMaker(PcMaker *this,Context *orig)

{
  Vec<unsigned_int> local_30;
  Context *local_18;
  Context *orig_local;
  PcMaker *this_local;
  
  local_18 = orig;
  orig_local = (Context *)this;
  Vec<unsigned_int>::Vec(&local_30);
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair<const_int_&,_true>
            (&this->res,&orig->flags,&local_30);
  Vec<unsigned_int>::~Vec(&local_30);
  this->orig = local_18;
  (this->res).first.mark = local_18->mark;
  return;
}

Assistant:

PcMaker( const Context *orig ) : res{ orig->flags, {} }, orig{ orig } {
        res.first.mark = orig->mark;
    }